

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

void * probe_access_s390x(CPUArchState_conflict29 *env,target_ulong addr,int size,
                         MMUAccessType access_type,int mmu_idx,uintptr_t retaddr)

{
  int flags;
  _Bool _Var1;
  ulong *puVar2;
  ulong index;
  undefined8 *puVar3;
  size_t mmu_idx_00;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  CPUS390XState_conflict *__mptr;
  ulong local_70;
  
  if (-(addr | 0xfffffffffffff000) < (ulong)(long)size) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
               ,0x4ab,"-(addr | TARGET_PAGE_MASK) >= size");
  }
  if (MMU_INST_FETCH < access_type) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
               ,0x4bc,(char *)0x0);
  }
  mmu_idx_00 = (size_t)mmu_idx;
  index = env->regs[mmu_idx_00 * 2 + -10] >> 6 & addr >> 0xc;
  lVar5 = index * 0x40 + env->regs[mmu_idx_00 * 2 + -9];
  uVar6 = (ulong)access_type;
  flags = *(int *)(&DAT_00dbdc3c + uVar6 * 4);
  local_70 = *(ulong *)(lVar5 + uVar6 * 8);
  if ((local_70 & 0xfffffffffffff800) != (addr & 0xfffffffffffff000)) {
    _Var1 = victim_tlb_hit(env,mmu_idx_00,index,uVar6 * 8,addr & 0xfffffffffffff000);
    if (_Var1) {
      puVar2 = (ulong *)(uVar6 * 8 + lVar5);
    }
    else {
      tlb_fill((CPUState *)(env[-0x1e].vregs + 0xf),addr,size,access_type,mmu_idx,retaddr);
      index = env->regs[mmu_idx_00 * 2 + -10] >> 6 & addr >> 0xc;
      lVar5 = index * 0x40 + env->regs[mmu_idx_00 * 2 + -9];
      puVar2 = (ulong *)(uVar6 * 8 + lVar5);
    }
    local_70 = *puVar2;
  }
  if (size == 0) {
LAB_00ca79c2:
    pvVar4 = (void *)0x0;
  }
  else {
    if ((local_70 & 0xfc0) != 0) {
      if ((local_70 & 0x2c0) != 0) goto LAB_00ca79c2;
      puVar3 = (undefined8 *)(index * 0x10 + *(long *)((long)env + mmu_idx_00 * 0x2b8 + -0x880));
      if (((uint)local_70 >> 8 & 1) != 0) {
        cpu_check_watchpoint_s390x
                  ((CPUState *)(env[-0x1e].vregs + 0xf),addr,(long)size,*(MemTxAttrs *)(puVar3 + 1),
                   flags,retaddr);
      }
      if (((uint)local_70 >> 10 & 1) != 0) {
        notdirty_write((CPUState *)(env[-0x1e].vregs + 0xf),addr,size,(CPUIOTLBEntry *)*puVar3,
                       retaddr);
      }
    }
    pvVar4 = (void *)(addr + *(long *)(lVar5 + 0x20));
  }
  return pvVar4;
}

Assistant:

void *probe_access(CPUArchState *env, target_ulong addr, int size,
                   MMUAccessType access_type, int mmu_idx, uintptr_t retaddr)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = env->uc;
#endif
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    target_ulong tlb_addr;
    size_t elt_ofs = 0;
    int wp_access = 0;

#ifdef _MSC_VER
    g_assert(((target_ulong)0 - (addr | TARGET_PAGE_MASK)) >= size);
#else
    g_assert(-(addr | TARGET_PAGE_MASK) >= size);
#endif

    switch (access_type) {
    case MMU_DATA_LOAD:
        elt_ofs = offsetof(CPUTLBEntry, addr_read);
        wp_access = BP_MEM_READ;
        break;
    case MMU_DATA_STORE:
        elt_ofs = offsetof(CPUTLBEntry, addr_write);
        wp_access = BP_MEM_WRITE;
        break;
    case MMU_INST_FETCH:
        elt_ofs = offsetof(CPUTLBEntry, addr_code);
        wp_access = BP_MEM_READ;
        break;
    default:
        g_assert_not_reached();
    }
    tlb_addr = tlb_read_ofs(entry, elt_ofs);

    if (unlikely(!tlb_hit(env->uc, tlb_addr, addr))) {
        if (!victim_tlb_hit(env, mmu_idx, index, elt_ofs,
                            addr & TARGET_PAGE_MASK)) {
            tlb_fill(env_cpu(env), addr, size, access_type, mmu_idx, retaddr);
            /* TLB resize via tlb_fill may have moved the entry. */
            index = tlb_index(env, mmu_idx, addr);
            entry = tlb_entry(env, mmu_idx, addr);
        }
        tlb_addr = tlb_read_ofs(entry, elt_ofs);
    }

    if (!size) {
        return NULL;
    }

    if (unlikely(tlb_addr & TLB_FLAGS_MASK)) {
        CPUIOTLBEntry *iotlbentry = &env_tlb(env)->d[mmu_idx].iotlb[index];

        /* Reject I/O access, or other required slow-path.  */
        if (tlb_addr & (TLB_MMIO | TLB_BSWAP | TLB_DISCARD_WRITE)) {
            return NULL;
        }

        /* Handle watchpoints.  */
        if (tlb_addr & TLB_WATCHPOINT) {
            cpu_check_watchpoint(env_cpu(env), addr, size,
                                 iotlbentry->attrs, wp_access, retaddr);
        }

        /* Handle clean RAM pages.  */
        if (tlb_addr & TLB_NOTDIRTY) {
            notdirty_write(env_cpu(env), addr, size, iotlbentry, retaddr);
        }
    }

    return (void *)((uintptr_t)addr + entry->addend);
}